

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testBatchedMatMulDynamicQuantizationConversionParameterValidation(void)

{
  string *psVar1;
  bool bVar2;
  NeuralNetwork *pNVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *this;
  NeuralNetworkLayer *this_00;
  BatchedMatMulLayerParams *this_01;
  WeightParams *this_02;
  QuantizationParams *pQVar7;
  LinearQuantizationParams *pLVar8;
  ostream *poVar9;
  ostream *poVar10;
  LookUpTableQuantizationParams *this_03;
  int iVar11;
  char *pcVar12;
  undefined1 local_a0 [40];
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  pNVar3 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  pNVar3->arrayinputshapemapping_ = 1;
  pMVar4 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar4->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"A");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar4 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar4->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"B");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar3->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,"batched_mat_mul");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_batchedmatmul(this_00);
  this_01->weightmatrixfirstdimension_ = 4;
  this_01->weightmatrixseconddimension_ = 2;
  this_01->hasbias_ = false;
  this_01->int8dynamicquantize_ = true;
  this_02 = CoreML::Specification::BatchedMatMulLayerParams::mutable_weights(this_01);
  CoreML::Specification::WeightParams::set_int8rawvalue(this_02,"11111111");
  pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
  pQVar7->numberofbits_ = 8;
  pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
  pLVar8 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar7);
  CoreML::Specification::LinearQuantizationParams::add_scale(pLVar8,4.0);
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    this_01->hasbias_ = true;
    CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
    CoreML::Result::operator=(&res,(Result *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    bVar2 = CoreML::Result::good(&res);
    if (!bVar2) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar10 = (ostream *)std::operator<<(poVar9,":");
      iVar11 = 0x2d1;
      goto LAB_00149c44;
    }
    this_01->hasbias_ = false;
    pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
    pLVar8 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar7);
    CoreML::Specification::LinearQuantizationParams::add_bias(pLVar8,0.0);
    CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
    CoreML::Result::operator=(&res,(Result *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    bVar2 = CoreML::Result::good(&res);
    if (bVar2) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar10 = (ostream *)std::operator<<(poVar9,":");
      iVar11 = 0x2d7;
    }
    else {
      pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
      pLVar8 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar7);
      (pLVar8->bias_).current_size_ = 0;
      pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
      pQVar7->numberofbits_ = 7;
      CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
      CoreML::Result::operator=(&res,(Result *)local_a0);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      bVar2 = CoreML::Result::good(&res);
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar10 = (ostream *)std::operator<<(poVar9,":");
        iVar11 = 0x2dd;
      }
      else {
        pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
        pQVar7->numberofbits_ = 8;
        pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
        this_03 = CoreML::Specification::QuantizationParams::mutable_lookuptablequantization(pQVar7)
        ;
        CoreML::Specification::LookUpTableQuantizationParams::add_floatvalue(this_03,1.0);
        CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
        CoreML::Result::operator=(&res,(Result *)local_a0);
        std::__cxx11::string::~string((string *)(local_a0 + 8));
        bVar2 = CoreML::Result::good(&res);
        if (bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar10 = (ostream *)std::operator<<(poVar9,":");
          iVar11 = 0x2e3;
        }
        else {
          pQVar7 = CoreML::Specification::WeightParams::mutable_quantization(this_02);
          pLVar8 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar7);
          CoreML::Specification::LinearQuantizationParams::add_scale(pLVar8,4.0);
          psVar1 = (this_02->int8rawvalue_).ptr_;
          if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            psVar1->_M_string_length = 0;
            *(psVar1->_M_dataplus)._M_p = '\0';
          }
          CoreML::Specification::WeightParams::set_rawvalue(this_02,"11111111");
          CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
          CoreML::Result::operator=(&res,(Result *)local_a0);
          std::__cxx11::string::~string((string *)(local_a0 + 8));
          bVar2 = CoreML::Result::good(&res);
          if (bVar2) {
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar10 = (ostream *)std::operator<<(poVar9,":");
            iVar11 = 0x2ea;
          }
          else {
            psVar1 = (this_02->rawvalue_).ptr_;
            if (psVar1 != (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              psVar1->_M_string_length = 0;
              *(psVar1->_M_dataplus)._M_p = '\0';
            }
            CoreML::Specification::WeightParams::set_float16value(this_02,"0101010101010101");
            CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
            CoreML::Result::operator=(&res,(Result *)local_a0);
            std::__cxx11::string::~string((string *)(local_a0 + 8));
            bVar2 = CoreML::Result::good(&res);
            if (bVar2) {
              poVar9 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar10 = (ostream *)std::operator<<(poVar9,":");
              iVar11 = 0x2f0;
            }
            else {
              psVar1 = (this_02->float16value_).ptr_;
              if (psVar1 != (string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                psVar1->_M_string_length = 0;
                *(psVar1->_M_dataplus)._M_p = '\0';
              }
              iVar11 = 8;
              while (bVar2 = iVar11 != 0, iVar11 = iVar11 + -1, bVar2) {
                CoreML::Specification::WeightParams::add_floatvalue(this_02,1.0);
              }
              CoreML::validate<(MLModelType)500>((Result *)local_a0,&m1);
              CoreML::Result::operator=(&res,(Result *)local_a0);
              std::__cxx11::string::~string((string *)(local_a0 + 8));
              bVar2 = CoreML::Result::good(&res);
              if (!bVar2) {
                (this_02->floatvalue_).current_size_ = 0;
                iVar11 = 0;
                goto LAB_00149f89;
              }
              poVar9 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar10 = (ostream *)std::operator<<(poVar9,":");
              iVar11 = 0x2f8;
            }
          }
        }
      }
    }
    poVar9 = (ostream *)std::ostream::operator<<(poVar10,iVar11);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar12 = "!((res).good())";
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar10 = (ostream *)std::operator<<(poVar9,":");
    iVar11 = 0x2cc;
LAB_00149c44:
    poVar9 = (ostream *)std::ostream::operator<<(poVar10,iVar11);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar12 = "(res).good()";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  poVar9 = std::operator<<(poVar9," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar11 = 1;
LAB_00149f89:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar11;
}

Assistant:

int testBatchedMatMulDynamicQuantizationConversionParameterValidation() {

    Specification::Model m1;
    Specification::NeuralNetwork* nnMain = m1.mutable_neuralnetwork();
    // Required for spec v4 and onwards
    nnMain->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnMain->add_layers();
    layer1->set_name("batched_mat_mul");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::BatchedMatMulLayerParams* batch_mat_mul_params = layer1->mutable_batchedmatmul();
    batch_mat_mul_params->set_weightmatrixfirstdimension(4);
    batch_mat_mul_params->set_weightmatrixseconddimension(2);
    batch_mat_mul_params->set_hasbias(false);
    batch_mat_mul_params->set_int8dynamicquantize(true);

    auto* weights = batch_mat_mul_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct validation
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    batch_mat_mul_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    batch_mat_mul_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(0);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}